

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window,bool snap_on_edges)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  float fVar7;
  float fVar8;
  ImVec2 IVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  
  pIVar6 = GImGui;
  fVar12 = (window->Scroll).x;
  fVar11 = (window->Scroll).y;
  fVar2 = (window->ScrollTarget).x;
  if (fVar2 < 3.4028235e+38) {
    fVar7 = (window->ScrollTargetCenterRatio).x;
    if ((((!snap_on_edges) || (0.0 < fVar7)) || (fVar12 = 0.0, (window->WindowPadding).x < fVar2))
       && ((fVar12 = fVar2, snap_on_edges && (1.0 <= fVar7)))) {
      fVar8 = (window->ContentSize).x;
      fVar3 = (window->WindowPadding).x;
      if (fVar8 + fVar3 + (GImGui->Style).ItemSpacing.x <= fVar2) {
        fVar12 = fVar3 + fVar3 + fVar8;
      }
    }
    fVar12 = fVar12 - fVar7 * ((window->SizeFull).x - (window->ScrollbarSizes).x);
  }
  pfVar1 = &(window->ScrollTarget).y;
  if (*pfVar1 <= 3.4028235e+38 && *pfVar1 != 3.4028235e+38) {
    fVar7 = ImGuiWindow::TitleBarHeight(window);
    fVar8 = ImGuiWindow::MenuBarHeight(window);
    fVar11 = (window->ScrollTarget).y;
    fVar2 = (window->ScrollTargetCenterRatio).y;
    if (((snap_on_edges) && (fVar2 <= 0.0)) && (fVar11 <= (window->WindowPadding).y)) {
      fVar11 = 0.0;
    }
    if ((snap_on_edges) && (1.0 <= fVar2)) {
      fVar3 = (window->ContentSize).y;
      fVar4 = (window->WindowPadding).y;
      if (fVar3 + fVar4 + (pIVar6->Style).ItemSpacing.y <= fVar11) {
        fVar11 = fVar4 + fVar4 + fVar3;
      }
    }
    fVar11 = fVar11 - fVar2 * (((window->SizeFull).y - (window->ScrollbarSizes).y) - (fVar7 + fVar8)
                              );
  }
  IVar9.x = (float)(-(uint)(0.0 <= fVar12) & (uint)fVar12);
  IVar9.y = (float)(-(uint)(0.0 <= fVar11) & (uint)fVar11);
  auVar10._8_8_ = 0;
  auVar10._0_4_ = IVar9.x;
  auVar10._4_4_ = IVar9.y;
  if ((window->Collapsed == false) && (window->SkipItems == false)) {
    auVar5._8_8_ = 0;
    auVar5._0_4_ = (window->ScrollMax).x;
    auVar5._4_4_ = (window->ScrollMax).y;
    auVar10 = minps(auVar10,auVar5);
    IVar9 = auVar10._0_8_;
  }
  return IVar9;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window, bool snap_on_edges)
{
    ImGuiContext& g = *GImGui;
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float cr_x = window->ScrollTargetCenterRatio.x;
        float target_x = window->ScrollTarget.x;
        if (snap_on_edges && cr_x <= 0.0f && target_x <= window->WindowPadding.x)
            target_x = 0.0f;
        else if (snap_on_edges && cr_x >= 1.0f && target_x >= window->ContentSize.x + window->WindowPadding.x + g.Style.ItemSpacing.x)
            target_x = window->ContentSize.x + window->WindowPadding.x * 2.0f;
        scroll.x = target_x - cr_x * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        // 'snap_on_edges' allows for a discontinuity at the edge of scrolling limits to take account of WindowPadding so that scrolling to make the last item visible scroll far enough to see the padding.
        float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
        float cr_y = window->ScrollTargetCenterRatio.y;
        float target_y = window->ScrollTarget.y;
        if (snap_on_edges && cr_y <= 0.0f && target_y <= window->WindowPadding.y)
            target_y = 0.0f;
        if (snap_on_edges && cr_y >= 1.0f && target_y >= window->ContentSize.y + window->WindowPadding.y + g.Style.ItemSpacing.y)
            target_y = window->ContentSize.y + window->WindowPadding.y * 2.0f;
        scroll.y = target_y - cr_y * (window->SizeFull.y - window->ScrollbarSizes.y - decoration_up_height);
    }
    scroll = ImMax(scroll, ImVec2(0.0f, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}